

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O0

void __thiscall Assimp::LWO::Shader::~Shader(Shader *this)

{
  Shader *this_local;
  
  std::__cxx11::string::~string((string *)&this->functionName);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Shader()
        :   ordinal         ("\x00")
        ,   functionName    ("unknown")
        ,   enabled         (true)
    {}